

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

void deqp::gls::LifetimeTests::details::readRectangle
               (RenderContext *renderCtx,Rectangle *rect,Surface *dst)

{
  int x;
  int y;
  Rectangle *context;
  PixelBufferAccess local_48;
  Surface *local_20;
  Surface *dst_local;
  Rectangle *rect_local;
  RenderContext *renderCtx_local;
  
  local_20 = dst;
  dst_local = (Surface *)rect;
  rect_local = (Rectangle *)renderCtx;
  tcu::Surface::setSize(dst,rect->width,rect->height);
  context = rect_local;
  x = dst_local->m_width;
  y = dst_local->m_height;
  tcu::Surface::getAccess(&local_48,local_20);
  glu::readPixels((RenderContext *)context,x,y,&local_48);
  return;
}

Assistant:

void readRectangle (const RenderContext& renderCtx, const Rectangle& rect, Surface& dst)
{
	dst.setSize(rect.width, rect.height);
	glu::readPixels(renderCtx, rect.x, rect.y, dst.getAccess());
}